

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-id.c++
# Opt level: O0

uint64_t __thiscall
capnp::compiler::generateChildId(compiler *this,uint64_t parentId,StringPtr childName)

{
  StringPtr data;
  size_t size;
  byte *pbVar1;
  uint local_114;
  ulong uStack_110;
  uint i_1;
  uint64_t result;
  ArrayPtr<const_unsigned_char> resultBytes;
  ArrayPtr<unsigned_char> local_e8;
  ArrayPtr<const_unsigned_char> local_d8;
  undefined1 local_c8 [8];
  TypeIdGenerator generator;
  uint i;
  byte parentIdBytes [8];
  uint64_t parentId_local;
  StringPtr childName_local;
  
  memset(generator.ctx.block + 0xf,0,8);
  for (generator.ctx.block[0xe] = 0; generator.ctx.block[0xe] < 8;
      generator.ctx.block[0xe] = generator.ctx.block[0xe] + 1) {
    *(char *)((long)generator.ctx.block + (ulong)generator.ctx.block[0xe] + 0x3c) =
         (char)((ulong)this >> ((byte)(generator.ctx.block[0xe] << 3) & 0x3f));
  }
  TypeIdGenerator::TypeIdGenerator((TypeIdGenerator *)local_c8);
  size = kj::size<unsigned_char,8ul>((uchar (*) [8])(generator.ctx.block + 0xf));
  local_e8 = kj::arrayPtr<unsigned_char>((uchar *)(generator.ctx.block + 0xf),size);
  local_d8 = kj::ArrayPtr::operator_cast_to_ArrayPtr((ArrayPtr *)&local_e8);
  TypeIdGenerator::update((TypeIdGenerator *)local_c8,local_d8);
  data.content.size_ = (size_t)childName.content.ptr;
  data.content.ptr = (char *)parentId;
  resultBytes.size_ = parentId;
  TypeIdGenerator::update((TypeIdGenerator *)local_c8,data);
  _result = TypeIdGenerator::finish((TypeIdGenerator *)local_c8);
  uStack_110 = 0;
  for (local_114 = 0; local_114 < 8; local_114 = local_114 + 1) {
    pbVar1 = kj::ArrayPtr<const_unsigned_char>::operator[]
                       ((ArrayPtr<const_unsigned_char> *)&result,(ulong)local_114);
    uStack_110 = uStack_110 << 8 | (ulong)*pbVar1;
  }
  return uStack_110 | 0x8000000000000000;
}

Assistant:

uint64_t generateChildId(uint64_t parentId, kj::StringPtr childName) {
  // Compute ID by hashing the concatenation of the parent ID and the declaration name, and
  // then taking the first 8 bytes.

  kj::byte parentIdBytes[sizeof(uint64_t)]{};
  for (uint i = 0; i < sizeof(uint64_t); i++) {
    parentIdBytes[i] = (parentId >> (i * 8)) & 0xff;
  }

  TypeIdGenerator generator;
  generator.update(kj::arrayPtr(parentIdBytes, kj::size(parentIdBytes)));
  generator.update(childName);

  kj::ArrayPtr<const kj::byte> resultBytes = generator.finish();

  uint64_t result = 0;
  for (uint i = 0; i < sizeof(uint64_t); i++) {
    result = (result << 8) | resultBytes[i];
  }

  return result | (1ull << 63);
}